

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_sleep(int ms)

{
  int iVar1;
  sqlite3_vfs *pVfs_00;
  int rc;
  sqlite3_vfs *pVfs;
  int ms_local;
  
  pVfs_00 = sqlite3_vfs_find((char *)0x0);
  if (pVfs_00 == (sqlite3_vfs *)0x0) {
    pVfs._4_4_ = 0;
  }
  else {
    iVar1 = sqlite3OsSleep(pVfs_00,ms * 1000);
    pVfs._4_4_ = iVar1 / 1000;
  }
  return pVfs._4_4_;
}

Assistant:

SQLITE_API int sqlite3_sleep(int ms){
  sqlite3_vfs *pVfs;
  int rc;
  pVfs = sqlite3_vfs_find(0);
  if( pVfs==0 ) return 0;

  /* This function works in milliseconds, but the underlying OsSleep()
  ** API uses microseconds. Hence the 1000's.
  */
  rc = (sqlite3OsSleep(pVfs, 1000*ms)/1000);
  return rc;
}